

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLDocumentProcessor.cpp
# Opt level: O0

Formula * __thiscall
COLLADASaxFWL::DocumentProcessor::getFormulaByUniqueId(DocumentProcessor *this,UniqueId *uniqueId)

{
  bool bVar1;
  pointer ppVar2;
  _Rb_tree_const_iterator<std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::Formula_*>_> *in_RDI;
  const_iterator it;
  Formula *formula;
  map<COLLADAFW::UniqueId,_COLLADAFW::Formula_*,_std::less<COLLADAFW::UniqueId>,_std::allocator<std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::Formula_*>_>_>
  *in_stack_ffffffffffffffb8;
  iterator local_38;
  _Rb_tree_const_iterator<std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::Formula_*>_> local_30;
  iterator local_28;
  _Rb_tree_const_iterator<std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::Formula_*>_> local_20;
  Formula *local_18;
  
  local_18 = (Formula *)0x0;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<COLLADAFW::UniqueId,_COLLADAFW::Formula_*,_std::less<COLLADAFW::UniqueId>,_std::allocator<std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::Formula_*>_>_>
       ::find(in_stack_ffffffffffffffb8,(key_type *)0x78a7cf);
  std::_Rb_tree_const_iterator<std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::Formula_*>_>::
  _Rb_tree_const_iterator(&local_20,&local_28);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<COLLADAFW::UniqueId,_COLLADAFW::Formula_*,_std::less<COLLADAFW::UniqueId>,_std::allocator<std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::Formula_*>_>_>
       ::end(in_stack_ffffffffffffffb8);
  std::_Rb_tree_const_iterator<std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::Formula_*>_>::
  _Rb_tree_const_iterator(&local_30,&local_38);
  bVar1 = std::operator!=(&local_20,&local_30);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::Formula_*>_>::
             operator->(in_RDI);
    local_18 = ppVar2->second;
  }
  return local_18;
}

Assistant:

COLLADAFW::Formula* DocumentProcessor::getFormulaByUniqueId( const COLLADAFW::UniqueId& uniqueId ) const
	{
		COLLADAFW::Formula* formula = 0;
		Loader::UniqueIdFormulaMap::const_iterator it = mFormulasMap.find(uniqueId);
		if ( it != mFormulasMap.end() )
		{
			formula = it->second;
		}
		return formula;
	}